

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O1

index_t __thiscall
GEO::PeriodicDelaunay3d::get_periodic_vertex_instances_to_create
          (PeriodicDelaunay3d *this,index_t v,ConvexCell *C,bool *use_instance,
          bool *cell_is_on_boundary,bool *cell_is_outside_cube,IncidentTetrahedra *W)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  pointer pTVar4;
  vec4 eqn;
  vec4 eqn_00;
  vec4 eqn_01;
  vec4 eqn_02;
  vec4 eqn_03;
  vec4 eqn_04;
  vec4 eqn_05;
  vec4 eqn_06;
  vec4 eqn_07;
  vec4 eqn_08;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  index_t iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  int TY;
  int iVar16;
  long lVar17;
  long lVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  uint uVar22;
  int VXLAT [3] [3];
  undefined1 local_218 [32];
  int local_1f8;
  bool *local_1e8;
  bool *local_1e0;
  string local_1d8;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  double dStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  double dStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  double dStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  double dStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  double dStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  double dStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  double dStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  double dStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 uStack_80;
  double dStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_1e8 = cell_is_on_boundary;
  local_1e0 = cell_is_outside_cube;
  copy_Laguerre_cell_from_Delaunay(this,v,C,W);
  if (C->first_valid_ == 0x3fff) {
    local_218._0_8_ = local_218 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"!C.empty()","");
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1d8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp"
               ,"");
    geo_assertion_failed((string *)local_218,&local_1d8,0x7b96);
  }
  use_instance[0] = false;
  use_instance[1] = false;
  use_instance[2] = false;
  use_instance[3] = false;
  use_instance[4] = false;
  use_instance[5] = false;
  use_instance[6] = false;
  use_instance[7] = false;
  use_instance[8] = false;
  use_instance[9] = false;
  use_instance[10] = false;
  use_instance[0xb] = false;
  use_instance[0xc] = false;
  use_instance[0xd] = false;
  use_instance[0xe] = false;
  use_instance[0xf] = false;
  use_instance[0xb] = false;
  use_instance[0xc] = false;
  use_instance[0xd] = false;
  use_instance[0xe] = false;
  use_instance[0xf] = false;
  use_instance[0x10] = false;
  use_instance[0x11] = false;
  use_instance[0x12] = false;
  use_instance[0x13] = false;
  use_instance[0x14] = false;
  use_instance[0x15] = false;
  use_instance[0x16] = false;
  use_instance[0x17] = false;
  use_instance[0x18] = false;
  use_instance[0x19] = false;
  use_instance[0x1a] = false;
  *use_instance = true;
  uVar2 = C->nb_v_;
  local_70 = 0x3ff0000000000000;
  uStack_68 = 0;
  uStack_60 = 0;
  uStack_58 = 0;
  VBW::ConvexCell::clip_by_plane(C,(vec4)ZEXT1632(ZEXT816(0x3ff0000000000000)));
  dStack_78 = this->period_;
  local_90 = 0xbff0000000000000;
  uStack_88 = 0;
  uStack_80 = 0;
  eqn.z = 0.0;
  eqn.x = -1.0;
  eqn.y = 0.0;
  eqn.w = dStack_78;
  VBW::ConvexCell::clip_by_plane(C,eqn);
  local_50 = 0;
  uStack_48 = 0x3ff0000000000000;
  local_40 = 0;
  uStack_38 = 0;
  VBW::ConvexCell::clip_by_plane(C,(vec4)ZEXT1632(ZEXT816(0x3ff0000000000000) << 0x40));
  dStack_160 = this->period_;
  local_178 = 0;
  uStack_170 = 0xbff0000000000000;
  local_168 = 0;
  eqn_00.z = 0.0;
  eqn_00.x = (double)SUB168(ZEXT816(0xbff0000000000000) << 0x40,0);
  eqn_00.y = (double)SUB168(ZEXT816(0xbff0000000000000) << 0x40,8);
  eqn_00.w = dStack_160;
  VBW::ConvexCell::clip_by_plane(C,eqn_00);
  local_f8 = 0;
  uStack_f0 = 0;
  local_e8 = 0x3ff0000000000000;
  uStack_e0 = 0;
  eqn_01.z = 1.0;
  eqn_01.x = 0.0;
  eqn_01.y = 0.0;
  eqn_01.w = 0.0;
  VBW::ConvexCell::clip_by_plane(C,eqn_01);
  dStack_100 = this->period_;
  local_118 = 0;
  uStack_110 = 0;
  local_108 = 0xbff0000000000000;
  eqn_02.z = -1.0;
  eqn_02.x = 0.0;
  eqn_02.y = 0.0;
  eqn_02.w = dStack_100;
  VBW::ConvexCell::clip_by_plane(C,eqn_02);
  *local_1e0 = false;
  *local_1e8 = false;
  uVar14 = C->first_valid_;
  if (uVar14 == 0x3fff) {
    *local_1e0 = true;
    copy_Laguerre_cell_from_Delaunay(this,v,C,W);
    dStack_98 = this->period_;
    local_b0 = 0x3ff0000000000000;
    uStack_a8 = 0;
    uStack_a0 = 0;
    eqn_03.z = 0.0;
    eqn_03.x = 1.0;
    eqn_03.y = 0.0;
    eqn_03.w = dStack_98;
    VBW::ConvexCell::clip_by_plane(C,eqn_03);
    dStack_b8 = this->period_ + this->period_;
    local_d0 = 0xbff0000000000000;
    uStack_c8 = 0;
    uStack_c0 = 0;
    eqn_04.z = 0.0;
    eqn_04.x = -1.0;
    eqn_04.y = 0.0;
    eqn_04.w = dStack_b8;
    VBW::ConvexCell::clip_by_plane(C,eqn_04);
    dStack_180 = this->period_;
    local_198 = 0;
    uStack_190 = 0x3ff0000000000000;
    local_188 = 0;
    eqn_05.z = 0.0;
    eqn_05.x = (double)SUB168(ZEXT816(0x3ff0000000000000) << 0x40,0);
    eqn_05.y = (double)SUB168(ZEXT816(0x3ff0000000000000) << 0x40,8);
    eqn_05.w = dStack_180;
    VBW::ConvexCell::clip_by_plane(C,eqn_05);
    dStack_1a0 = this->period_ + this->period_;
    local_1b8 = 0;
    uStack_1b0 = 0xbff0000000000000;
    local_1a8 = 0;
    eqn_06.z = 0.0;
    eqn_06.x = (double)SUB168(ZEXT816(0xbff0000000000000) << 0x40,0);
    eqn_06.y = (double)SUB168(ZEXT816(0xbff0000000000000) << 0x40,8);
    eqn_06.w = dStack_1a0;
    VBW::ConvexCell::clip_by_plane(C,eqn_06);
    dStack_120 = this->period_;
    local_138 = 0;
    uStack_130 = 0;
    local_128 = 0x3ff0000000000000;
    eqn_07.z = 1.0;
    eqn_07.x = 0.0;
    eqn_07.y = 0.0;
    eqn_07.w = dStack_120;
    VBW::ConvexCell::clip_by_plane(C,eqn_07);
    dStack_140 = this->period_ + this->period_;
    local_158 = 0;
    uStack_150 = 0;
    local_148 = 0xbff0000000000000;
    eqn_08.z = -1.0;
    eqn_08.x = 0.0;
    eqn_08.y = 0.0;
    eqn_08.w = dStack_140;
    VBW::ConvexCell::clip_by_plane(C,eqn_08);
    if (C->first_valid_ == 0x3fff) {
      local_218._0_8_ = local_218 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"!C.empty()","");
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1d8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp"
                 ,"");
      geo_assertion_failed((string *)local_218,&local_1d8,0x7bc1);
    }
    local_218._0_8_ = (pointer)0x3ff0000000000000;
    local_218._8_8_ = 0.0;
    local_218._16_8_ = 0.0;
    local_218._24_8_ = 0.0;
    bVar5 = VBW::ConvexCell::cell_has_conflict(C,(vec4 *)local_218);
    local_218._24_8_ = this->period_;
    local_218._0_8_ = (pointer)0xbff0000000000000;
    local_218._8_8_ = 0.0;
    local_218._16_8_ = 0.0;
    bVar6 = VBW::ConvexCell::cell_has_conflict(C,(vec4 *)local_218);
    local_1e8 = (bool *)CONCAT71(local_1e8._1_7_,bVar6);
    local_218._0_8_ = (pointer)0x0;
    local_218._8_8_ = 1.0;
    local_218._16_8_ = 0.0;
    local_218._24_8_ = 0.0;
    bVar6 = VBW::ConvexCell::cell_has_conflict(C,(vec4 *)local_218);
    local_1e0 = (bool *)(ulong)bVar6;
    local_218._24_8_ = this->period_;
    local_218._0_8_ = (pointer)0x0;
    local_218._8_8_ = -1.0;
    local_218._16_8_ = 0.0;
    bVar7 = VBW::ConvexCell::cell_has_conflict(C,(vec4 *)local_218);
    local_218._0_8_ = (pointer)0x0;
    local_218._8_8_ = 0.0;
    local_218._16_8_ = 1.0;
    local_218._24_8_ = 0.0;
    bVar8 = VBW::ConvexCell::cell_has_conflict(C,(vec4 *)local_218);
    local_218._24_8_ = this->period_;
    local_218._0_8_ = (pointer)0x0;
    local_218._8_8_ = 0.0;
    local_218._16_8_ = -1.0;
    bVar9 = VBW::ConvexCell::cell_has_conflict(C,(vec4 *)local_218);
    iVar12 = -(uint)bVar5;
    iVar10 = (int)local_1e0 * 3 + (uint)bVar8 + (uint)bVar5 + (uint)bVar5 * 8 + 0xd;
    lVar15 = (ulong)bVar9 + (ulong)bVar8 + 1;
    lVar17 = lVar15;
    iVar13 = iVar10;
    iVar16 = -(uint)bVar6;
    iVar21 = iVar10;
    do {
      do {
        do {
          use_instance[*(uint *)(Periodic::reorder_instances + (long)iVar10 * 4)] = true;
          iVar10 = iVar10 + -1;
          lVar17 = lVar17 + -1;
        } while (lVar17 != 0);
        iVar16 = iVar16 + 1;
        iVar10 = iVar21 + -3;
        lVar17 = lVar15;
        iVar21 = iVar10;
      } while (iVar16 != bVar7 + 1);
      iVar12 = iVar12 + 1;
      iVar10 = iVar13 + -9;
      iVar13 = iVar10;
      iVar16 = -(uint)bVar6;
      iVar21 = iVar10;
    } while (iVar12 != (byte)local_1e8 + 1);
  }
  else if ((uVar14 & 0xffff) != 0x3fff) {
    pTVar4 = (C->t_).
             super_vector<VBW::TriangleWithFlags,_GEO::Memory::aligned_allocator<VBW::TriangleWithFlags,_64>_>
             .
             super__Vector_base<VBW::TriangleWithFlags,_GEO::Memory::aligned_allocator<VBW::TriangleWithFlags,_64>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      uVar14 = uVar14 & 0xffff;
      uVar1 = pTVar4[uVar14].super_Triangle.k;
      uVar3._0_2_ = pTVar4[uVar14].super_Triangle.i;
      uVar3._2_2_ = pTVar4[uVar14].super_Triangle.j;
      lVar17 = 0;
      bVar5 = false;
      do {
        uVar20 = 0;
        if (lVar17 == 0) {
          uVar20 = uVar3 & 0xffff;
        }
        uVar22 = 0;
        if (lVar17 == 0xc) {
          uVar22 = uVar3 >> 0x10;
        }
        uVar19 = 0;
        if (lVar17 == 0x18) {
          uVar19 = (uint)uVar1;
        }
        uVar19 = uVar19 + uVar22 + uVar20;
        uVar20 = uVar19 - uVar2;
        if (uVar19 < uVar2) {
          *(undefined8 *)(local_218 + lVar17) = 0;
          iVar13 = 0;
        }
        else {
          *(undefined8 *)(local_218 + lVar17) =
               *(undefined8 *)get_periodic_vertex_instances_to_create::T[uVar20];
          iVar13 = get_periodic_vertex_instances_to_create::T[uVar20][2];
          bVar5 = true;
        }
        *(int *)(local_218 + lVar17 + 8) = iVar13;
        lVar17 = lVar17 + 0xc;
      } while (lVar17 != 0x24);
      if (bVar5) {
        *local_1e8 = true;
        iVar13 = 0xd;
        lVar17 = 0;
        do {
          lVar15 = 0;
          iVar16 = iVar13;
          do {
            lVar18 = 1;
            iVar21 = iVar16;
            do {
              use_instance[*(uint *)(Periodic::reorder_instances + (long)iVar21 * 4)] = true;
              iVar21 = iVar21 + local_218._28_4_ * 3 + local_218._24_4_ * 9 + local_1f8;
              lVar18 = lVar18 + -1;
            } while (lVar18 == 0);
            iVar16 = iVar16 + local_218._16_4_ * 3 + local_218._12_4_ * 9 + local_218._20_4_;
            bVar5 = lVar15 == 0;
            lVar15 = lVar15 + 1;
          } while (bVar5);
          iVar13 = iVar13 + local_218._4_4_ * 3 + local_218._0_4_ * 9 + local_218._8_4_;
          bVar5 = lVar17 == 0;
          lVar17 = lVar17 + 1;
        } while (bVar5);
      }
      uVar14 = (uint)pTVar4[uVar14].flags;
    } while (uVar14 != 0x3fff);
  }
  iVar11 = 0;
  lVar17 = 1;
  do {
    iVar11 = iVar11 + use_instance[lVar17];
    lVar17 = lVar17 + 1;
  } while (lVar17 != 0x1b);
  return iVar11;
}

Assistant:

index_t PeriodicDelaunay3d::get_periodic_vertex_instances_to_create(
	index_t v,
	ConvexCell& C,
	bool use_instance[27],
	bool& cell_is_on_boundary,
	bool& cell_is_outside_cube,
	IncidentTetrahedra& W
    ) {	
	// Integer translations associated with the six plane equations
	// Note: indexing matches code below (order of the clipping
	// operations).
	static int T[6][3]= {
	    { 1, 0, 0},
	    {-1, 0, 0},
	    { 0, 1, 0},
	    { 0,-1, 0},
	    { 0, 0, 1},
	    { 0, 0,-1}
	};

	copy_Laguerre_cell_from_Delaunay(v, C, W);
	geo_assert(!C.empty());
	    
	// Determine the periodic instances of the vertex to be created
	// ************************************************************
	//   - Find all the intersected boundary faces
	//   - The instances to create correspond to all the possible
	//     sums of translation vectors associated with the
	//     intersected boundary faces
	
	FOR(i,27) {
	    use_instance[i] = false;
	}
	use_instance[0] = true;

	index_t cube_offset = C.nb_v();
	C.clip_by_plane(vec4( 1.0, 0.0, 0.0,  0.0));
	C.clip_by_plane(vec4(-1.0, 0.0, 0.0,  period_));
	C.clip_by_plane(vec4( 0.0, 1.0, 0.0,  0.0));
	C.clip_by_plane(vec4( 0.0,-1.0, 0.0,  period_));	
	C.clip_by_plane(vec4( 0.0, 0.0, 1.0,  0.0));
	C.clip_by_plane(vec4( 0.0, 0.0,-1.0,  period_));

	cell_is_outside_cube = false;
	cell_is_on_boundary = false;
	
	if(C.empty()) {
	    // Special case: cell is completely outside the cube.	    
	    cell_is_outside_cube = true;
	    copy_Laguerre_cell_from_Delaunay(v, C, W);
	    // Clip the cell with the 3x3x3 (rubic's) cube that
	    // surrounds the cube. Not only this avoids generating
	    // some unnecessary virtual vertices, but also, without
	    // it, it would generate neighborhoods with virtual vertices
	    // coordinates that differ by more than twice the period.
	    C.clip_by_plane(vec4( 1.0, 0.0, 0.0,  period_));
	    C.clip_by_plane(vec4(-1.0, 0.0, 0.0,  2.0*period_));
	    C.clip_by_plane(vec4( 0.0, 1.0, 0.0,  period_));
	    C.clip_by_plane(vec4( 0.0,-1.0, 0.0,  2.0*period_));	
	    C.clip_by_plane(vec4( 0.0, 0.0, 1.0,  period_));
	    C.clip_by_plane(vec4( 0.0, 0.0,-1.0,  2.0*period_));

	    // Normally we cannot have an empty cell, empty cells were
	    // detected before.
	    geo_assert(!C.empty());
	    
	    // Now detect the bounds of the sub-(rubic's) cube overlapped
	    // by the cell.
	    int TXmin = 0, TXmax = 0,
		TYmin = 0, TYmax = 0,
		TZmin = 0, TZmax = 0;
	    if(C.cell_has_conflict(vec4( 1.0, 0.0, 0.0,  0.0))) {
		TXmin = -1;
	    }
	    if(C.cell_has_conflict(vec4(-1.0, 0.0, 0.0,  period_))) {
		TXmax = 1;
	    }
	    if(C.cell_has_conflict(vec4( 0.0, 1.0, 0.0,  0.0))) {
		TYmin = -1;
	    }
	    if(C.cell_has_conflict(vec4( 0.0,-1.0, 0.0,  period_))) {
		TYmax = 1;
	    }
	    if(C.cell_has_conflict(vec4( 0.0, 0.0, 1.0,  0.0))) {
		TZmin = -1;
	    } 
	    if(C.cell_has_conflict(vec4( 0.0, 0.0,-1.0,  period_))) {
		TZmax = 1;
	    } 
	    for(int TX = TXmin; TX <= TXmax; ++TX) {
		for(int TY = TYmin; TY <= TYmax; ++TY) {
		    for(int TZ = TZmin; TZ <= TZmax; ++TZ) {
			use_instance[T_to_instance(-TX,-TY,-TZ)] = true;
		    }
		}
	    }
	} else {
	    // Back to the normal case, C contains the Laguerre cell clipped
	    // by the cube.
	    //   - Find all the intersected boundary faces
	    //   - The instances to create correspond to all the possible
	    //     sums of translation vectors associated with the
	    //     intersected boundary faces
	    
	    // Traverse all the Voronoi vertices of the face
	    for(
		VBW::ushort t = C.first_triangle();
		t!=VBW::END_OF_LIST; t=C.next_triangle(t)
	    ) {
		// The three (integer) translations associated with the
		// three faces on which the Voronoi vertex resides.
		int VXLAT[3][3];
		bool vertex_on_boundary = false;
		for(index_t lv=0; lv<3; ++lv) {
		    index_t pp = C.triangle_v_local_index(t,VBW::index_t(lv));
		    if(pp < cube_offset) {
			// Not a boundary face -> translation is zero.
			VXLAT[lv][0] = 0;
			VXLAT[lv][1] = 0;
			VXLAT[lv][2] = 0;
		    } else {
			// Boundary face -> there is a translation
			VXLAT[lv][0] = T[pp - cube_offset][0];
			VXLAT[lv][1] = T[pp - cube_offset][1];
			VXLAT[lv][2] = T[pp - cube_offset][2];
			vertex_on_boundary = true;
		    }
		}
		// If the vertex is on the boundary, mark all the instances
		// obtained by applying any combination of the (up to 3)
		// translations associated with the (up to 3)
		// boundary facets on which the vertex resides.
		if(vertex_on_boundary) {
		    cell_is_on_boundary = true;
		    for(int dU=0; dU<2; ++dU) {
			for(int dV=0; dV<2; ++dV) {
			    for(int dW=0; dW<2; ++dW) {
				
				int Tx = dU*VXLAT[0][0] + dV*VXLAT[1][0] +
				    dW*VXLAT[2][0];
				
				int Ty = dU*VXLAT[0][1] + dV*VXLAT[1][1] +
				    dW*VXLAT[2][1];
				
				int Tz = dU*VXLAT[0][2] + dV*VXLAT[1][2] +
				    dW*VXLAT[2][2];
				
				use_instance[T_to_instance(Tx,Ty,Tz)] = true;
			    }
			}
		    }
		}
	    }
	}
	index_t result = 0;
	for(index_t i=1; i<27; ++i) {
	    result += (use_instance[i] ? 1 : 0);
	}
	return result;
    }